

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t __thiscall
icu_63::MessagePattern::parseArg
          (MessagePattern *this,int32_t index,int32_t argStartLength,int32_t nestingLevel,
          UParseError *parseError,UErrorCode *errorCode)

{
  short sVar1;
  char16_t cVar2;
  int iVar3;
  UBool UVar4;
  byte bVar5;
  int32_t index_00;
  int32_t limit;
  uint uVar6;
  uint uVar7;
  int32_t length;
  int iVar8;
  char16_t *pcVar9;
  long lVar10;
  UMessagePatternPartType type;
  uint uVar11;
  uint index_01;
  UMessagePatternArgType argType;
  char16_t *pcVar12;
  
  iVar3 = this->partsLength;
  addPart(this,UMSGPAT_PART_TYPE_ARG_START,index,argStartLength,0,errorCode);
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  index_00 = skipWhiteSpace(this,argStartLength + index);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar8 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    iVar8 = (int)sVar1 >> 5;
  }
  if (index_00 == iVar8) {
LAB_0028940f:
    setParseError(this,parseError,0);
    *errorCode = U_UNMATCHED_BRACES;
    return 0;
  }
  limit = skipIdentifier(this,index_00);
  uVar6 = parseArgNumber(&this->msg,index_00,limit);
  if ((int)uVar6 < 0) {
    if (uVar6 != 0xffffffff) goto LAB_00289573;
    length = limit - index_00;
    if (0xffff < length) goto LAB_002894db;
    this->hasArgNames = '\x01';
    type = UMSGPAT_PART_TYPE_ARG_NAME;
    uVar6 = 0;
  }
  else {
    length = limit - index_00;
    if (0x7fff < uVar6 || 0xffff < length) goto LAB_002894db;
    this->hasArgNumbers = '\x01';
    type = UMSGPAT_PART_TYPE_ARG_NUMBER;
  }
  addPart(this,type,index_00,length,uVar6,errorCode);
  uVar6 = skipWhiteSpace(this,limit);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar7 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar7 = (int)sVar1 >> 5;
  }
  if (uVar6 == uVar7) goto LAB_0028940f;
  if (uVar7 <= uVar6) goto LAB_00289573;
  pcVar12 = (char16_t *)((long)&(this->msg).fUnion + 2);
  pcVar9 = pcVar12;
  if (((int)sVar1 & 2U) == 0) {
    pcVar9 = (this->msg).fUnion.fFields.fArray;
  }
  if (pcVar9[(int)uVar6] != L',') {
    if (pcVar9[(int)uVar6] != L'}') goto LAB_00289573;
    argType = UMSGPAT_ARG_TYPE_NONE;
    goto LAB_00289539;
  }
  uVar7 = skipWhiteSpace(this,uVar6 + 1);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar6 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar6 = (int)sVar1 >> 5;
  }
  index_01 = uVar7;
  if (uVar7 < uVar6 && (int)uVar7 < (int)uVar6) {
    pcVar9 = pcVar12;
    if (((int)sVar1 & 2U) == 0) {
      pcVar9 = (this->msg).fUnion.fFields.fArray;
    }
    uVar11 = uVar7;
    lVar10 = (long)(int)uVar7;
    do {
      index_01 = uVar11;
      if ((((ushort)pcVar9[lVar10] & 0xffffffdf) - 0x5b < 0xffffffe6) ||
         (index_01 = uVar6, (long)(int)uVar6 <= lVar10 + 1)) break;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 1;
    } while (uVar11 < uVar6);
  }
  uVar6 = skipWhiteSpace(this,index_01);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar11 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar11 = (int)sVar1 >> 5;
  }
  if (uVar6 == uVar11) goto LAB_0028940f;
  if ((index_01 == uVar7) || (uVar11 <= uVar6)) goto LAB_00289573;
  if (((int)sVar1 & 2U) == 0) {
    pcVar12 = (this->msg).fUnion.fFields.fArray;
  }
  cVar2 = pcVar12[(int)uVar6];
  if ((cVar2 != L',') && (cVar2 != L'}')) goto LAB_00289573;
  iVar8 = index_01 - uVar7;
  if (0xffff < iVar8) {
LAB_002894db:
    setParseError(this,parseError,index_00);
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0;
  }
  if (iVar8 == 0xd) {
    UVar4 = isSelect(this,uVar7);
    if (UVar4 == '\0') goto LAB_00289743;
    bVar5 = isOrdinal(this,uVar7 + 6);
    (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar3].value
         = (ushort)bVar5 * 4 + 1;
    argType = UMSGPAT_ARG_TYPE_SELECTORDINAL;
    if (bVar5 != 0) goto LAB_0028980c;
  }
  else {
    if (iVar8 == 6) {
      UVar4 = isChoice(this,uVar7);
      if (UVar4 != '\0') {
        (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar3].
        value = 2;
        if (cVar2 != L'}') {
          uVar6 = parseChoiceStyle(this,uVar6 + 1,nestingLevel,parseError,errorCode);
          argType = UMSGPAT_ARG_TYPE_CHOICE;
          goto LAB_00289539;
        }
        goto LAB_00289573;
      }
      UVar4 = isPlural(this,uVar7);
      if (UVar4 == '\0') {
        UVar4 = isSelect(this,uVar7);
        argType = UMSGPAT_ARG_TYPE_SELECT;
        (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar3].
        value = (ushort)(UVar4 != '\0') * 3 + 1;
        if (UVar4 == '\0') goto LAB_0028975a;
      }
      else {
        (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar3].
        value = 3;
        argType = UMSGPAT_ARG_TYPE_PLURAL;
      }
LAB_0028980c:
      if (cVar2 == L'}') {
LAB_00289573:
        setParseError(this,parseError,index_00);
        *errorCode = U_PATTERN_SYNTAX_ERROR;
        return 0;
      }
      uVar6 = parsePluralOrSelectStyle(this,argType,uVar6 + 1,nestingLevel,parseError,errorCode);
      goto LAB_00289539;
    }
LAB_00289743:
    (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar3].value
         = 1;
  }
LAB_0028975a:
  addPart(this,UMSGPAT_PART_TYPE_ARG_TYPE,uVar7,iVar8,0,errorCode);
  argType = UMSGPAT_ARG_TYPE_SIMPLE;
  if (cVar2 != L'}') {
    uVar6 = parseSimpleStyle(this,uVar6 + 1,parseError,errorCode);
  }
LAB_00289539:
  (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar3].
  limitPartIndex = this->partsLength;
  addPart(this,UMSGPAT_PART_TYPE_ARG_LIMIT,uVar6,1,argType,errorCode);
  return uVar6 + 1;
}

Assistant:

int32_t
MessagePattern::parseArg(int32_t index, int32_t argStartLength, int32_t nestingLevel,
                         UParseError *parseError, UErrorCode &errorCode) {
    int32_t argStart=partsLength;
    UMessagePatternArgType argType=UMSGPAT_ARG_TYPE_NONE;
    addPart(UMSGPAT_PART_TYPE_ARG_START, index, argStartLength, argType, errorCode);
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t nameIndex=index=skipWhiteSpace(index+argStartLength);
    if(index==msg.length()) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    // parse argument name or number
    index=skipIdentifier(index);
    int32_t number=parseArgNumber(nameIndex, index);
    if(number>=0) {
        int32_t length=index-nameIndex;
        if(length>Part::MAX_LENGTH || number>Part::MAX_VALUE) {
            setParseError(parseError, nameIndex);  // Argument number too large.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        hasArgNumbers=TRUE;
        addPart(UMSGPAT_PART_TYPE_ARG_NUMBER, nameIndex, length, number, errorCode);
    } else if(number==UMSGPAT_ARG_NAME_NOT_NUMBER) {
        int32_t length=index-nameIndex;
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, nameIndex);  // Argument name too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        hasArgNames=TRUE;
        addPart(UMSGPAT_PART_TYPE_ARG_NAME, nameIndex, length, 0, errorCode);
    } else {  // number<-1 (ARG_NAME_NOT_VALID)
        setParseError(parseError, nameIndex);  // Bad argument syntax.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    }
    index=skipWhiteSpace(index);
    if(index==msg.length()) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    UChar c=msg.charAt(index);
    if(c==u_rightCurlyBrace) {
        // all done
    } else if(c!=u_comma) {
        setParseError(parseError, nameIndex);  // Bad argument syntax.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    } else /* ',' */ {
        // parse argument type: case-sensitive a-zA-Z
        int32_t typeIndex=index=skipWhiteSpace(index+1);
        while(index<msg.length() && isArgTypeChar(msg.charAt(index))) {
            ++index;
        }
        int32_t length=index-typeIndex;
        index=skipWhiteSpace(index);
        if(index==msg.length()) {
            setParseError(parseError, 0);  // Unmatched '{' braces in message.
            errorCode=U_UNMATCHED_BRACES;
            return 0;
        }
        if(length==0 || ((c=msg.charAt(index))!=u_comma && c!=u_rightCurlyBrace)) {
            setParseError(parseError, nameIndex);  // Bad argument syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, nameIndex);  // Argument type name too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        argType=UMSGPAT_ARG_TYPE_SIMPLE;
        if(length==6) {
            // case-insensitive comparisons for complex-type names
            if(isChoice(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_CHOICE;
            } else if(isPlural(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_PLURAL;
            } else if(isSelect(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_SELECT;
            }
        } else if(length==13) {
            if(isSelect(typeIndex) && isOrdinal(typeIndex+6)) {
                argType=UMSGPAT_ARG_TYPE_SELECTORDINAL;
            }
        }
        // change the ARG_START type from NONE to argType
        partsList->a[argStart].value=(int16_t)argType;
        if(argType==UMSGPAT_ARG_TYPE_SIMPLE) {
            addPart(UMSGPAT_PART_TYPE_ARG_TYPE, typeIndex, length, 0, errorCode);
        }
        // look for an argument style (pattern)
        if(c==u_rightCurlyBrace) {
            if(argType!=UMSGPAT_ARG_TYPE_SIMPLE) {
                setParseError(parseError, nameIndex);  // No style field for complex argument.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
        } else /* ',' */ {
            ++index;
            if(argType==UMSGPAT_ARG_TYPE_SIMPLE) {
                index=parseSimpleStyle(index, parseError, errorCode);
            } else if(argType==UMSGPAT_ARG_TYPE_CHOICE) {
                index=parseChoiceStyle(index, nestingLevel, parseError, errorCode);
            } else {
                index=parsePluralOrSelectStyle(argType, index, nestingLevel, parseError, errorCode);
            }
        }
    }
    // Argument parsing stopped on the '}'.
    addLimitPart(argStart, UMSGPAT_PART_TYPE_ARG_LIMIT, index, 1, argType, errorCode);
    return index+1;
}